

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_wiener_convolve_add_src_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  InterpKernel *paiVar1;
  int16_t *in_R8;
  int16_t *in_stack_00000008;
  int intermediate_height;
  uint16_t temp [33664];
  int y0_q4;
  InterpKernel *filters_y;
  int x0_q4;
  InterpKernel *filters_x;
  int in_stack_fffffffffffef89c;
  InterpKernel *in_stack_fffffffffffef8a0;
  ptrdiff_t in_stack_fffffffffffef8a8;
  uint16_t *in_stack_fffffffffffef8b0;
  ptrdiff_t in_stack_fffffffffffef8b8;
  uint16_t *in_stack_fffffffffffef8c0;
  int in_stack_fffffffffffef8d0;
  int in_stack_fffffffffffef8d8;
  int in_stack_fffffffffffef8e0;
  int in_stack_fffffffffffef8e8;
  int in_stack_fffffffffffef8f0;
  
  paiVar1 = get_filter_base(in_R8);
  get_filter_offset(in_R8,paiVar1);
  paiVar1 = get_filter_base(in_stack_00000008);
  get_filter_offset(in_stack_00000008,paiVar1);
  highbd_convolve_add_src_horiz_hip
            ((uint8_t *)in_stack_fffffffffffef8c0,in_stack_fffffffffffef8b8,
             in_stack_fffffffffffef8b0,in_stack_fffffffffffef8a8,in_stack_fffffffffffef8a0,
             in_stack_fffffffffffef89c,in_stack_fffffffffffef8d0,in_stack_fffffffffffef8d8,
             in_stack_fffffffffffef8e0,in_stack_fffffffffffef8e8,in_stack_fffffffffffef8f0);
  highbd_convolve_add_src_vert_hip
            (in_stack_fffffffffffef8c0,in_stack_fffffffffffef8b8,
             (uint8_t *)in_stack_fffffffffffef8b0,in_stack_fffffffffffef8a8,
             in_stack_fffffffffffef8a0,in_stack_fffffffffffef89c,in_stack_fffffffffffef8d0,
             in_stack_fffffffffffef8d8,in_stack_fffffffffffef8e0,in_stack_fffffffffffef8e8,
             in_stack_fffffffffffef8f0);
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_c(
    const uint8_t *src, ptrdiff_t src_stride, uint8_t *dst,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);

  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);

  uint16_t temp[WIENER_MAX_EXT_SIZE * MAX_SB_SIZE];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS;

  assert(w <= MAX_SB_SIZE);
  assert(h <= MAX_SB_SIZE);
  assert(y_step_q4 <= 32);
  assert(x_step_q4 <= 32);
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);

  highbd_convolve_add_src_horiz_hip(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                                    src_stride, temp, MAX_SB_SIZE, filters_x,
                                    x0_q4, x_step_q4, w, intermediate_height,
                                    conv_params->round_0, bd);
  highbd_convolve_add_src_vert_hip(
      temp + MAX_SB_SIZE * (SUBPEL_TAPS / 2 - 1), MAX_SB_SIZE, dst, dst_stride,
      filters_y, y0_q4, y_step_q4, w, h, conv_params->round_1, bd);
}